

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UBool __thiscall icu_63::Calendar::isEquivalentTo(Calendar *this,Calendar *other)

{
  bool bVar1;
  int iVar2;
  bool local_21;
  Calendar *other_local;
  Calendar *this_local;
  
  if (this == (Calendar *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  local_21 = false;
  if ((((((bVar1) && (local_21 = false, this->fLenient == other->fLenient)) &&
        (local_21 = false, this->fRepeatedWallTime == other->fRepeatedWallTime)) &&
       ((local_21 = false, this->fSkippedWallTime == other->fSkippedWallTime &&
        (local_21 = false, this->fFirstDayOfWeek == other->fFirstDayOfWeek)))) &&
      ((local_21 = false, this->fMinimalDaysInFirstWeek == other->fMinimalDaysInFirstWeek &&
       ((local_21 = false, this->fWeekendOnset == other->fWeekendOnset &&
        (local_21 = false, this->fWeekendOnsetMillis == other->fWeekendOnsetMillis)))))) &&
     ((local_21 = false, this->fWeekendCease == other->fWeekendCease &&
      (local_21 = false, this->fWeekendCeaseMillis == other->fWeekendCeaseMillis)))) {
    iVar2 = (*(this->fZone->super_UObject)._vptr_UObject[3])(this->fZone,other->fZone);
    local_21 = (char)iVar2 != '\0';
  }
  return local_21;
}

Assistant:

UBool
Calendar::isEquivalentTo(const Calendar& other) const
{
    return typeid(*this) == typeid(other) &&
        fLenient                == other.fLenient &&
        fRepeatedWallTime       == other.fRepeatedWallTime &&
        fSkippedWallTime        == other.fSkippedWallTime &&
        fFirstDayOfWeek         == other.fFirstDayOfWeek &&
        fMinimalDaysInFirstWeek == other.fMinimalDaysInFirstWeek &&
        fWeekendOnset           == other.fWeekendOnset &&
        fWeekendOnsetMillis     == other.fWeekendOnsetMillis &&
        fWeekendCease           == other.fWeekendCease &&
        fWeekendCeaseMillis     == other.fWeekendCeaseMillis &&
        *fZone                  == *other.fZone;
}